

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O1

void __thiscall
google::
dense_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
::
copy_or_move_from<google::dense_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>>
          (dense_hashtable<std::pair<HashObject<8,8>const,int>,HashObject<8,8>,HashFn,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SelectKey,google::dense_hash_map<HashObject<8,8>,int,HashFn,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>::SetKey,std::equal_to<HashObject<8,8>>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>const,int>>>
           *this,dense_hashtable<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
                 *ht,size_type min_buckets_wanted)

{
  pointer ppVar1;
  int iVar2;
  undefined4 uVar3;
  size_type sVar4;
  undefined8 uVar5;
  undefined6 uVar6;
  undefined1 auVar7 [12];
  pair<const_HashObject<8,_8>,_int> *value;
  size_type new_num_buckets;
  pointer ppVar8;
  int iVar9;
  int iVar10;
  int *piVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  short sVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 uVar19;
  undefined2 uVar20;
  
  new_num_buckets =
       sparsehash_internal::sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>::
       min_buckets((sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4> *)this,
                   ht->num_elements - ht->num_deleted,min_buckets_wanted);
  dense_hashtable<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  ::clear_to_size((dense_hashtable<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
                   *)this,new_num_buckets);
  sVar4 = ht->num_buckets;
  ppVar8 = ht->table;
  ppVar1 = ppVar8 + sVar4;
  iVar10 = g_num_hashes;
  iVar9 = g_num_copies;
  if (sVar4 != 0) {
    lVar12 = sVar4 * 0xc;
    do {
      iVar2 = (ppVar8->first).i_;
      if (((ht->key_info).empty_key.i_ != iVar2) &&
         (ht->num_deleted == 0 || (ht->key_info).delkey.i_ != iVar2)) break;
      ppVar8 = ppVar8 + 1;
      lVar12 = lVar12 + -0xc;
    } while (lVar12 != 0);
  }
  do {
    do {
      if (ppVar8 == ppVar1) {
        *(int *)(this + 0x1c) = *(int *)(this + 0x1c) + 1;
        return;
      }
      iVar10 = iVar10 + 1;
      uVar3 = *(undefined4 *)(ppVar8->first).buffer_;
      uVar19 = (undefined1)((uint)uVar3 >> 0x18);
      uVar20 = CONCAT11(uVar19,uVar19);
      uVar19 = (undefined1)((uint)uVar3 >> 0x10);
      uVar5 = CONCAT35(CONCAT21(uVar20,uVar19),CONCAT14(uVar19,uVar3));
      uVar19 = (undefined1)((uint)uVar3 >> 8);
      uVar6 = CONCAT51(CONCAT41((int)((ulong)uVar5 >> 0x20),uVar19),uVar19);
      sVar15 = CONCAT11((char)uVar3,(char)uVar3);
      uVar13 = CONCAT62(uVar6,sVar15);
      auVar18._8_4_ = 0;
      auVar18._0_8_ = uVar13;
      auVar18._12_2_ = uVar20;
      auVar18._14_2_ = uVar20;
      uVar20 = (undefined2)((ulong)uVar5 >> 0x20);
      auVar17._12_4_ = auVar18._12_4_;
      auVar17._8_2_ = 0;
      auVar17._0_8_ = uVar13;
      auVar17._10_2_ = uVar20;
      auVar16._10_6_ = auVar17._10_6_;
      auVar16._8_2_ = uVar20;
      auVar16._0_8_ = uVar13;
      uVar20 = (undefined2)uVar6;
      auVar7._4_8_ = auVar16._8_8_;
      auVar7._2_2_ = uVar20;
      auVar7._0_2_ = uVar20;
      lVar12 = *(long *)(this + 0x50);
      uVar13 = (long)((auVar17._12_4_ >> 0x18) + (auVar7._0_4_ >> 0x18) +
                     (auVar16._8_4_ >> 0x18) + ((int)sVar15 >> 8) + (ppVar8->first).i_) &
               *(long *)(this + 0x40) - 1U;
      if (*(int *)(this + 0x28) != *(int *)(lVar12 + uVar13 * 0xc)) {
        lVar14 = 1;
        do {
          uVar13 = uVar13 + lVar14 & *(long *)(this + 0x40) - 1U;
          lVar14 = lVar14 + 1;
        } while (*(int *)(this + 0x28) != *(int *)(lVar12 + uVar13 * 0xc));
      }
      piVar11 = (int *)(lVar12 + uVar13 * 0xc);
      iVar9 = iVar9 + 1;
      g_num_hashes = iVar10;
      g_num_copies = iVar9;
      *piVar11 = (ppVar8->first).i_;
      piVar11[1] = *(int *)(ppVar8->first).buffer_;
      piVar11[2] = ppVar8->second;
      *(long *)(this + 0x38) = *(long *)(this + 0x38) + 1;
      ppVar8 = ppVar8 + 1;
    } while (ppVar8 == ppVar1);
    do {
      iVar2 = (ppVar8->first).i_;
      if (((ht->key_info).empty_key.i_ != iVar2) &&
         (ht->num_deleted == 0 || (ht->key_info).delkey.i_ != iVar2)) break;
      ppVar8 = ppVar8 + 1;
    } while (ppVar8 != ppVar1);
  } while( true );
}

Assistant:

void copy_or_move_from(Hashtable&& ht, size_type min_buckets_wanted) {
    clear_to_size(settings.min_buckets(ht.size(), min_buckets_wanted));

    // We use a normal iterator to get non-deleted bcks from ht
    // We could use insert() here, but since we know there are
    // no duplicates and no deleted items, we can be more efficient
    assert((bucket_count() & (bucket_count() - 1)) == 0);  // a power of two
    for (auto&& value : ht) {
      size_type num_probes = 0;  // how many times we've probed
      size_type bucknum;
      const size_type bucket_count_minus_one = bucket_count() - 1;
      for (bucknum = hash(get_key(value)) & bucket_count_minus_one;
           !test_empty(bucknum);  // not empty
           bucknum =
               (bucknum + JUMP_(key, num_probes)) & bucket_count_minus_one) {
        ++num_probes;
        assert(num_probes < bucket_count() &&
               "Hashtable is full: an error in key_equal<> or hash<>");
      }

      using will_move = std::is_rvalue_reference<Hashtable&&>;
      using value_t = typename std::conditional<will_move::value, value_type&&, const_reference>::type;

      set_value(&table[bucknum], std::forward<value_t>(value));
      num_elements++;
    }
    settings.inc_num_ht_copies();
  }